

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unixWrite(unqlite_file *id,void *pBuf,unqlite_int64 amt,unqlite_int64 offset)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  __off_t _Var4;
  ssize_t sVar5;
  int *piVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  size_t sVar10;
  
  bVar2 = 0 < amt;
  if (amt < 1) {
    bVar8 = 0;
  }
  else {
    do {
      _Var4 = lseek(*(int *)&id[2].pMethods,offset,0);
      if (_Var4 == offset) {
        sVar5 = write(*(int *)&id[2].pMethods,pBuf,amt);
        uVar9 = (uint)sVar5;
        if ((int)uVar9 < 0) {
          piVar6 = __errno_location();
          *(int *)((long)&id[3].pMethods + 4) = *piVar6;
        }
      }
      else {
        if (_Var4 == -1) {
          piVar6 = __errno_location();
          *(int *)((long)&id[3].pMethods + 4) = *piVar6;
        }
        else {
          *(undefined4 *)((long)&id[3].pMethods + 4) = 0;
        }
        uVar9 = 0xffffffff;
      }
      if ((int)uVar9 < 1) break;
      uVar7 = (ulong)uVar9;
      offset = offset + uVar7;
      pBuf = (void *)((long)pBuf + uVar7);
      bVar2 = amt != uVar7 && -1 < (long)(amt - uVar7);
      sVar10 = amt - uVar7;
      bVar1 = (long)uVar7 <= amt;
      amt = sVar10;
    } while (sVar10 != 0 && bVar1);
    bVar8 = (byte)(uVar9 >> 0x1f);
  }
  iVar3 = (uint)(byte)~bVar2 * 2 + -2;
  if ((bVar8 == 0) && (bVar2)) {
    *(undefined4 *)((long)&id[3].pMethods + 4) = 0;
    iVar3 = -0x49;
  }
  return iVar3;
}

Assistant:

static int unixWrite(
  unqlite_file *id, 
  const void *pBuf, 
  unqlite_int64 amt,
  unqlite_int64 offset 
){
  unixFile *pFile = (unixFile*)id;
  int wrote = 0;

  while( amt>0 && (wrote = seekAndWrite(pFile, offset, pBuf, amt))>0 ){
    amt -= wrote;
    offset += wrote;
    pBuf = &((char*)pBuf)[wrote];
  }
  
  if( amt>0 ){
    if( wrote<0 ){
      /* lastErrno set by seekAndWrite */
      return UNQLITE_IOERR;
    }else{
      pFile->lastErrno = 0; /* not a system error */
      return UNQLITE_FULL;
    }
  }
  return UNQLITE_OK;
}